

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkLock::IntLoadConstraint_Ct(ChLinkLock *this,uint off_L,ChVectorDynamic<> *Qc,double c)

{
  undefined1 auVar1 [16];
  pointer ppCVar2;
  double *pdVar3;
  long lVar4;
  undefined1 auVar5 [16];
  long lVar6;
  char *__function;
  ulong uVar7;
  long lVar8;
  int iVar9;
  undefined8 in_XMM0_Qb;
  undefined1 auVar10 [16];
  
  lVar6 = (long)(this->mask).super_ChLinkMask.nconstr;
  if (0 < lVar6) {
    ppCVar2 = (this->mask).super_ChLinkMask.constraints.
              super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pdVar3 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    lVar4 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    lVar8 = 0;
    iVar9 = 0;
    do {
      if ((this->mask).super_ChLinkMask.nconstr <= lVar8) {
        __assert_fail("(i >= 0) && (i < nconstr)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLinkMask.h"
                      ,0x37,"ChConstraintTwoBodies &chrono::ChLinkMask::Constr_N(int)");
      }
      if ((ppCVar2[lVar8]->super_ChConstraintTwo).super_ChConstraint.active == true) {
        if ((iVar9 < 0) ||
           ((this->Ct).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
            m_rows <= (long)iVar9)) {
          __function = 
          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1, 0, 7, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1, 0, 7, 1>, Level = 1]"
          ;
LAB_00591a26:
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,__function);
        }
        uVar7 = (ulong)(iVar9 + off_L);
        if (lVar4 <= (long)uVar7) {
          __function = 
          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
          ;
          goto LAB_00591a26;
        }
        auVar10._8_8_ = 0;
        auVar10._0_8_ =
             (this->Ct).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
             m_data.array[iVar9];
        auVar1._8_8_ = 0;
        auVar1._0_8_ = pdVar3[uVar7];
        auVar5._8_8_ = in_XMM0_Qb;
        auVar5._0_8_ = c;
        auVar1 = vfmadd213sd_fma(auVar10,auVar5,auVar1);
        pdVar3[uVar7] = auVar1._0_8_;
        iVar9 = iVar9 + 1;
      }
      lVar8 = lVar8 + 1;
    } while (lVar6 != lVar8);
  }
  return;
}

Assistant:

void ChLinkLock::IntLoadConstraint_Ct(const unsigned int off_L,  // offset in Qc residual
                                      ChVectorDynamic<>& Qc,     // result: the Qc residual, Qc += c*Ct
                                      const double c)            // a scaling factor
{
    int cnt = 0;
    for (int i = 0; i < mask.nconstr; i++) {
        if (mask.Constr_N(i).IsActive()) {
            Qc(off_L + cnt) += c * Ct(cnt);
            cnt++;
        }
    }

    // nothing to do for ChLinkLimit
}